

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall gl4cts::GPUShaderFP64Test4::verifyUniformValues(GPUShaderFP64Test4 *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  GLuint GVar4;
  GLuint GVar5;
  int iVar6;
  double *pdVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  MessageBuilder *pMVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  _stage_data **pp_Var16;
  bool bVar17;
  int iVar18;
  long lVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  long local_3b0;
  undefined8 local_378;
  _stage_data *cs_stages [1];
  uint returned_uint_data [4];
  int returned_int_data [4];
  float returned_float_data [4];
  uniform_value_pair dvec4_uniforms [5];
  uniform_value_pair dvec3_uniforms [5];
  uniform_value_pair dvec2_uniforms [5];
  uniform_value_pair double_uniforms [5];
  double returned_double_data [4];
  undefined1 auStack_1d8 [8];
  ostream local_1d0;
  _stage_data *noncs_stages [5];
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  cs_stages[0] = &this->m_data_cs;
  noncs_stages[0] = &this->m_data_fs;
  noncs_stages[1] = &this->m_data_gs;
  noncs_stages[2] = &this->m_data_tc;
  noncs_stages[3] = &this->m_data_te;
  noncs_stages[4] = &this->m_data_vs;
  uVar2 = this->m_po_cs_id;
  uVar3 = this->m_po_noncs_id;
  local_378 = CONCAT44(uVar2,uVar3);
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  bVar17 = true;
  for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
    GVar4 = *(GLuint *)((long)cs_stages + lVar14 * 4 + -8);
    GVar5 = this->m_po_cs_id;
    pp_Var16 = noncs_stages;
    if (GVar4 == GVar5) {
      pp_Var16 = cs_stages;
    }
    if (GVar4 != 0) {
      for (lVar13 = 0; lVar13 != (ulong)(GVar4 != GVar5) * 4 + 1; lVar13 = lVar13 + 1) {
        double_uniforms[3].second = (double *)pp_Var16[lVar13];
        double_uniforms[0].first =
             (((_stage_data *)double_uniforms[3].second)->uniforms).uniform_location_double;
        double_uniforms[0].second =
             &(((_stage_data *)double_uniforms[3].second)->uniforms).uniform_double;
        double_uniforms[1].first =
             (((_stage_data *)double_uniforms[3].second)->uniforms).uniform_location_double_arr[0];
        double_uniforms[1].second =
             (((_stage_data *)double_uniforms[3].second)->uniforms).uniform_double_arr;
        double_uniforms[2].first =
             (((_stage_data *)double_uniforms[3].second)->uniforms).uniform_location_double_arr[1];
        double_uniforms[2].second =
             (((_stage_data *)double_uniforms[3].second)->uniforms).uniform_double_arr + 1;
        double_uniforms[3].first =
             ((_stage_data *)double_uniforms[3].second)->uniform_structure_arrays[0].
             uniform_location_double;
        double_uniforms[4].first =
             ((_stage_data *)double_uniforms[3].second)->uniform_structure_arrays[1].
             uniform_location_double;
        double_uniforms[4].second =
             &((_stage_data *)double_uniforms[3].second)->uniform_structure_arrays[1].uniform_double
        ;
        iVar8 = 0;
        local_3b0 = 4;
        while (iVar8 != 4) {
          iVar8 = iVar8 + 1;
          for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
            iVar6 = double_uniforms[lVar12].first;
            pdVar7 = double_uniforms[lVar12].second;
            (**(code **)(lVar10 + 0xb58))(GVar4,iVar6,returned_double_data);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,"glGetUniformdv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bbe);
            (**(code **)(lVar10 + 0xb60))(GVar4,iVar6,returned_float_data);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,"glGetUniformfv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc1);
            (**(code **)(lVar10 + 0xb68))(GVar4,iVar6,returned_int_data);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,"glGetUniformiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc4);
            (**(code **)(lVar10 + 0xb70))(GVar4,iVar6,returned_uint_data);
            dVar9 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar9,"glGetUniformuiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc7);
            lVar19 = 0;
            for (lVar15 = 0; local_3b0 != lVar15; lVar15 = lVar15 + 4) {
              dVar23 = *(double *)((long)pdVar7 + lVar15 * 2);
              dVar21 = *(double *)((long)returned_double_data + lVar15 * 2) - dVar23;
              dVar22 = -dVar21;
              if (-dVar21 <= dVar21) {
                dVar22 = dVar21;
              }
              if (9.999999747378752e-06 < dVar22) {
                auStack_1d8 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
                std::operator<<(&local_1d0,
                                "Invalid uniform value reported by glGetUniformdv() for uniform location ["
                               );
                std::ostream::operator<<((ostringstream *)&local_1d0,iVar6);
                std::operator<<(&local_1d0,"] and component [");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
                std::operator<<(&local_1d0,"]: retrieved:[");
                pMVar11 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)auStack_1d8,
                                     (double *)((long)returned_double_data + lVar19));
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"], expected:[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(double *)((long)pdVar7 + lVar19))
                ;
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
                dVar23 = *(double *)((long)pdVar7 + lVar15 * 2);
                bVar17 = false;
              }
              dVar21 = (double)*(float *)((long)returned_float_data + lVar15) - dVar23;
              dVar22 = -dVar21;
              if (-dVar21 <= dVar21) {
                dVar22 = dVar21;
              }
              if (9.999999747378752e-06 < dVar22) {
                auStack_1d8 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
                std::operator<<(&local_1d0,
                                "Invalid uniform value reported by glGetUniformfv() for uniform location ["
                               );
                std::ostream::operator<<((ostringstream *)&local_1d0,iVar6);
                std::operator<<(&local_1d0,"] and component [");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
                std::operator<<(&local_1d0,"]: retrieved:[");
                pMVar11 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)auStack_1d8,
                                     (float *)((long)returned_float_data + lVar15));
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"], expected:[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(double *)((long)pdVar7 + lVar19))
                ;
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
                dVar23 = *(double *)((long)pdVar7 + lVar15 * 2);
                bVar17 = false;
              }
              fVar20 = floorf((float)dVar23 + 0.5);
              iVar18 = (int)(long)fVar20;
              if (dVar23 <= 0.0) {
                iVar18 = 0;
              }
              if (*(int *)((long)returned_int_data + lVar15) != (int)fVar20) {
                auStack_1d8 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
                std::operator<<(&local_1d0,
                                "Invalid uniform value reported by glGetUniformiv() for uniform location ["
                               );
                std::ostream::operator<<(&local_1d0,iVar6);
                std::operator<<(&local_1d0,"] and component [");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
                std::operator<<(&local_1d0,"]: retrieved:[");
                pMVar11 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)auStack_1d8,
                                     (int *)((long)returned_int_data + lVar15));
                poVar1 = &pMVar11->m_str;
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                "], expected:[");
                std::ostream::operator<<(poVar1,(int)fVar20);
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
                bVar17 = false;
              }
              if (*(int *)((long)returned_uint_data + lVar15) != iVar18) {
                auStack_1d8 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
                std::operator<<(&local_1d0,
                                "Invalid uniform value reported by glGetUniformuiv() for uniform location ["
                               );
                std::ostream::operator<<(&local_1d0,iVar6);
                std::operator<<(&local_1d0,"] and component [");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
                std::operator<<(&local_1d0,"]: retrieved:[");
                pMVar11 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)auStack_1d8,
                                     (uint *)((long)returned_uint_data + lVar15));
                poVar1 = &pMVar11->m_str;
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                "], expected:[");
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
                bVar17 = false;
              }
              lVar19 = lVar19 + 8;
            }
          }
          local_3b0 = local_3b0 + 4;
        }
      }
    }
  }
  return bVar17;
}

Assistant:

bool GPUShaderFP64Test4::verifyUniformValues()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	_stage_data*	   cs_stages[]	= { &m_data_cs };
	_stage_data*	   noncs_stages[] = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages	= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint programs[] = {
		m_po_noncs_id, m_po_cs_id,
	};
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	/* Set up rounding for the tests */
	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id		 = programs[n_program];
		unsigned int  n_stages   = 0;
		_stage_data** stage_data = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages   = n_cs_stages;
			stage_data = cs_stages;
		}
		else
		{
			n_stages   = n_noncs_stages;
			stage_data = noncs_stages;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr = stage_data[n_stage];

			/* Set up arrays that we will guide the automated testing */
			const uniform_value_pair double_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double, &stage_ptr->uniforms.uniform_double),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[0],
								   stage_ptr->uniforms.uniform_double_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[1],
								   stage_ptr->uniforms.uniform_double_arr + 1),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[0].uniform_double),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[1].uniform_double)
			};
			const uniform_value_pair dvec2_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2, stage_ptr->uniforms.uniform_dvec2),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[0],
								   stage_ptr->uniforms.uniform_dvec2_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[1],
								   stage_ptr->uniforms.uniform_dvec2_arr + 2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec2)
			};
			const uniform_value_pair dvec3_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3, stage_ptr->uniforms.uniform_dvec3),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[0],
								   stage_ptr->uniforms.uniform_dvec3_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[1],
								   stage_ptr->uniforms.uniform_dvec3_arr + 3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec3)
			};
			const uniform_value_pair dvec4_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4, stage_ptr->uniforms.uniform_dvec4),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[0],
								   stage_ptr->uniforms.uniform_dvec4_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[1],
								   stage_ptr->uniforms.uniform_dvec4_arr + 4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec4)
			};

			/* Iterate over all uniforms and verify the values reported by the API */
			double		 returned_double_data[4];
			float		 returned_float_data[4];
			int			 returned_int_data[4];
			unsigned int returned_uint_data[4];

			for (unsigned int n_type = 0; n_type < 4 /* double/dvec2/dvec3/dvec4 */; ++n_type)
			{
				const uniform_value_pair* current_uv_pairs  = NULL;
				const unsigned int		  n_components_used = n_type + 1; /* n_type=0: double, n_type=1: dvec2, etc.. */
				unsigned int			  n_pairs			= 0;

				switch (n_type)
				{
				case 0: /* double */
				{
					current_uv_pairs = double_uniforms;
					n_pairs			 = sizeof(double_uniforms) / sizeof(double_uniforms[0]);

					break;
				}

				case 1: /* dvec2 */
				{
					current_uv_pairs = dvec2_uniforms;
					n_pairs			 = sizeof(dvec2_uniforms) / sizeof(dvec2_uniforms[0]);

					break;
				}

				case 2: /* dvec3 */
				{
					current_uv_pairs = dvec3_uniforms;
					n_pairs			 = sizeof(dvec3_uniforms) / sizeof(dvec3_uniforms[0]);

					break;
				}

				case 3: /* dvec4 */
				{
					current_uv_pairs = dvec4_uniforms;
					n_pairs			 = sizeof(dvec4_uniforms) / sizeof(dvec4_uniforms[0]);

					break;
				}

				default:
				{
					TCU_FAIL("Invalid type index requested");
				}
				} /* switch (n_type) */

				for (unsigned int n_pair = 0; n_pair < n_pairs; ++n_pair)
				{
					const uniform_value_pair& current_uv_pair  = current_uv_pairs[n_pair];
					glw::GLint				  uniform_location = current_uv_pair.first;
					const double*			  uniform_value	= current_uv_pair.second;

					/* Retrieve the values from the GL implementation*/
					gl.getUniformdv(po_id, uniform_location, returned_double_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformdv() call failed.");

					gl.getUniformfv(po_id, uniform_location, returned_float_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformfv() call failed.");

					gl.getUniformiv(po_id, uniform_location, returned_int_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformiv() call failed.");

					gl.getUniformuiv(po_id, uniform_location, returned_uint_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformuiv() call failed.");

					/* Make sure the values reported match the reference values */
					bool		can_continue = true;
					const float epsilon		 = 1e-5f;

					for (unsigned int n_component = 0; n_component < n_components_used && can_continue; ++n_component)
					{
						if (de::abs(returned_double_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformdv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_double_data[n_component] << "]"
																		", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (de::abs(returned_float_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformfv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_float_data[n_component] << "]"
																	   ", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						/* ints */
						int rounded_uniform_value_sint = (int)(deFloatRound((float)uniform_value[n_component]));
						unsigned int rounded_uniform_value_uint =
							(unsigned int)(uniform_value[n_component] > 0.0) ?
								((unsigned int)deFloatRound((float)uniform_value[n_component])) :
								0;

						if (returned_int_data[n_component] != rounded_uniform_value_sint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_int_data[n_component] << "]"
																	 ", expected:["
								<< rounded_uniform_value_sint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (returned_uint_data[n_component] != rounded_uniform_value_uint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformuiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_uint_data[n_component] << "]"
																	  ", expected:["
								<< rounded_uniform_value_uint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}
					} /* for (all components) */
				}	 /* for (all uniform+value pairs) */
			}		  /* for (all 4 uniform types) */
		}			  /* for (all shader stages) */
	}				  /* for (both program objects) */

	/* All done! */
	return result;
}